

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

timediff_t Curl_timeleft(Curl_easy *data,curltime *nowp,_Bool duringconnect)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  timediff_t tVar9;
  curltime older;
  curltime cVar10;
  curltime newer;
  curltime newer_00;
  uint local_64;
  undefined4 uStack_54;
  undefined1 local_50 [8];
  curltime now;
  timediff_t timeout_ms;
  timediff_t maxtime_timeout_ms;
  timediff_t connect_timeout_ms;
  uint timeout_set;
  _Bool duringconnect_local;
  curltime *nowp_local;
  Curl_easy *data_local;
  
  connect_timeout_ms._0_4_ = 0;
  maxtime_timeout_ms = 0;
  timeout_ms = 0;
  now.tv_usec = 0;
  now._12_4_ = 0;
  if ((data->set).timeout != 0) {
    connect_timeout_ms._0_4_ = 2;
    timeout_ms = (timediff_t)(data->set).timeout;
  }
  if (duringconnect) {
    connect_timeout_ms._0_4_ = (uint)connect_timeout_ms | 1;
    if ((data->set).connecttimeout == 0) {
      local_64 = 300000;
    }
    else {
      local_64 = (data->set).connecttimeout;
    }
    maxtime_timeout_ms = (timediff_t)local_64;
  }
  if ((uint)connect_timeout_ms == 0) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    _timeout_set = nowp;
    if (nowp == (curltime *)0x0) {
      cVar10 = Curl_now();
      local_50 = (undefined1  [8])cVar10.tv_sec;
      now.tv_sec = CONCAT44(uStack_54,cVar10.tv_usec);
      _timeout_set = (curltime *)local_50;
    }
    if (((uint)connect_timeout_ms & 2) != 0) {
      uVar3 = _timeout_set->tv_sec;
      uVar4 = _timeout_set->tv_usec;
      newer.tv_usec = uVar4;
      newer.tv_sec = uVar3;
      uVar1 = (data->progress).t_startop.tv_sec;
      uVar2 = (data->progress).t_startop.tv_usec;
      cVar10.tv_usec = uVar2;
      cVar10.tv_sec = uVar1;
      cVar10._12_4_ = 0;
      newer._12_4_ = 0;
      tVar9 = Curl_timediff(newer,cVar10);
      now._8_8_ = timeout_ms - tVar9;
      timeout_ms = now._8_8_;
    }
    if (((uint)connect_timeout_ms & 1) != 0) {
      uVar7 = _timeout_set->tv_sec;
      uVar8 = _timeout_set->tv_usec;
      newer_00.tv_usec = uVar8;
      newer_00.tv_sec = uVar7;
      uVar5 = (data->progress).t_startsingle.tv_sec;
      uVar6 = (data->progress).t_startsingle.tv_usec;
      older.tv_usec = uVar6;
      older.tv_sec = uVar5;
      older._12_4_ = 0;
      newer_00._12_4_ = 0;
      tVar9 = Curl_timediff(newer_00,older);
      if ((((uint)connect_timeout_ms & 2) == 0) || (maxtime_timeout_ms - tVar9 < timeout_ms)) {
        now._8_8_ = maxtime_timeout_ms - tVar9;
      }
    }
    if (now._8_8_ == 0) {
      data_local = (Curl_easy *)0xffffffffffffffff;
    }
    else {
      data_local = (Curl_easy *)now._8_8_;
    }
  }
  return (timediff_t)data_local;
}

Assistant:

timediff_t Curl_timeleft(struct Curl_easy *data,
                         struct curltime *nowp,
                         bool duringconnect)
{
  unsigned int timeout_set = 0;
  timediff_t connect_timeout_ms = 0;
  timediff_t maxtime_timeout_ms = 0;
  timediff_t timeout_ms = 0;
  struct curltime now;

  /* The duration of a connect and the total transfer are calculated from two
     different time-stamps. It can end up with the total timeout being reached
     before the connect timeout expires and we must acknowledge whichever
     timeout that is reached first. The total timeout is set per entire
     operation, while the connect timeout is set per connect. */

  if(data->set.timeout > 0) {
    timeout_set = TIMEOUT_MAXTIME;
    maxtime_timeout_ms = data->set.timeout;
  }
  if(duringconnect) {
    timeout_set |= TIMEOUT_CONNECT;
    connect_timeout_ms = (data->set.connecttimeout > 0) ?
      data->set.connecttimeout : DEFAULT_CONNECT_TIMEOUT;
  }
  if(!timeout_set)
    /* no timeout  */
    return 0;

  if(!nowp) {
    now = Curl_now();
    nowp = &now;
  }

  if(timeout_set & TIMEOUT_MAXTIME) {
    maxtime_timeout_ms -= Curl_timediff(*nowp, data->progress.t_startop);
    timeout_ms = maxtime_timeout_ms;
  }

  if(timeout_set & TIMEOUT_CONNECT) {
    connect_timeout_ms -= Curl_timediff(*nowp, data->progress.t_startsingle);

    if(!(timeout_set & TIMEOUT_MAXTIME) ||
       (connect_timeout_ms < maxtime_timeout_ms))
      timeout_ms = connect_timeout_ms;
  }

  if(!timeout_ms)
    /* avoid returning 0 as that means no timeout! */
    return -1;

  return timeout_ms;
}